

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::TestDynamicStructHandler::decode
          (TestDynamicStructHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  Reader input_00;
  Field field_00;
  Builder builder;
  undefined1 auVar1 [8];
  SegmentReader *pSVar2;
  CapTableReader *pCVar3;
  void *pvVar4;
  WirePointer *pWVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  uint index;
  Orphanage orphanage_00;
  Iterator IVar9;
  Type type;
  undefined8 in_stack_fffffffffffffd28;
  Orphan<capnp::DynamicValue> local_240;
  bool local_208;
  undefined7 uStack_207;
  Schema SStack_200;
  undefined8 local_1f8;
  SegmentReader *pSStack_1f0;
  CapTableReader *local_1e8;
  void *pvStack_1e0;
  WirePointer *local_1d8;
  StructDataBitCount SStack_1d0;
  StructPointerCount SStack_1cc;
  undefined2 uStack_1ca;
  undefined1 auStack_1c8 [8];
  Reader item;
  Fault local_188;
  Fault f;
  uint local_178;
  DebugExpression<unsigned_int> local_174;
  undefined1 local_170 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition;
  Field field;
  undefined1 local_100 [8];
  Iterator __end3;
  undefined1 local_e0 [8];
  Iterator __begin3;
  FieldList *__range3;
  Reader items;
  undefined1 local_90 [8];
  FieldList fields;
  Orphanage orphanage;
  JsonCodec *codec_local;
  TestDynamicStructHandler *this_local;
  
  fields.list.reader._40_8_ = output.schema.super_Schema.raw;
  builder.builder._32_8_ = in_stack_fffffffffffffd28;
  builder._0_40_ = output.builder;
  orphanage_00 = Orphanage::getForMessageContaining<capnp::DynamicStruct::Builder>(builder);
  items.reader._40_8_ = DynamicStruct::Builder::getSchema(&output);
  StructSchema::getFields((FieldList *)local_90,(StructSchema *)&items.reader.nestingLimit);
  capnp::json::Value::Reader::getArray((Reader *)&__range3,&input);
  __begin3._8_8_ = (FieldList *)local_90;
  IVar9 = StructSchema::FieldList::begin((FieldList *)local_90);
  __end3._8_8_ = IVar9.container;
  __begin3.container._0_4_ = IVar9.index;
  local_e0 = (undefined1  [8])__end3._8_8_;
  IVar9 = StructSchema::FieldList::end((FieldList *)__begin3._8_8_);
  local_100 = (undefined1  [8])IVar9.container;
  __end3.container._0_4_ = IVar9.index;
  while( true ) {
    bVar8 = IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
            operator==((IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                        *)local_e0,
                       (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                        *)local_100);
    if (((bVar8 ^ 0xffU) & 1) == 0) {
      return;
    }
    IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::operator*
              ((Field *)&_kjCondition.result,
               (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> *
               )local_e0);
    local_178 = StructSchema::Field::getIndex((Field *)&_kjCondition.result);
    local_174 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_178);
    f.exception._4_4_ = List<capnp::json::Value,_(capnp::Kind)3>::Reader::size((Reader *)&__range3);
    kj::_::DebugExpression<unsigned_int>::operator<
              ((DebugComparison<unsigned_int,_unsigned_int> *)local_170,&local_174,
               (uint *)((long)&f.exception + 4));
    bVar8 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_170);
    if (!bVar8) break;
    index = StructSchema::Field::getIndex((Field *)&_kjCondition.result);
    List<capnp::json::Value,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)auStack_1c8,(Reader *)&__range3,index);
    bVar8 = capnp::json::Value::Reader::isNull((Reader *)auStack_1c8);
    uVar6 = item._reader._32_8_;
    pWVar5 = item._reader.pointers;
    pvVar4 = item._reader.data;
    pCVar3 = item._reader.capTable;
    pSVar2 = item._reader.segment;
    auVar1 = auStack_1c8;
    if (!bVar8) {
      local_1d8 = field.proto._reader.pointers;
      _SStack_1d0 = field.proto._reader._32_8_;
      local_1e8 = field.proto._reader.capTable;
      pvStack_1e0 = field.proto._reader.data;
      local_1f8 = field._8_8_;
      pSStack_1f0 = field.proto._reader.segment;
      local_208 = _kjCondition.result;
      uStack_207 = _kjCondition._25_7_;
      SStack_200 = field.parent.super_Schema.raw;
      type = StructSchema::Field::getType((Field *)&_kjCondition.result);
      uVar7 = item._reader._32_8_;
      input_00._reader.capTable = (CapTableReader *)pSVar2;
      input_00._reader.segment = (SegmentReader *)auVar1;
      input_00._reader.data = pCVar3;
      input_00._reader.pointers = (WirePointer *)pvVar4;
      input_00._reader._32_8_ = pWVar5;
      item._reader.dataSize = (StructDataBitCount)uVar6;
      item._reader.pointerCount = SUB82(uVar6,4);
      item._reader._38_2_ = SUB82(uVar6,6);
      input_00._reader.nestingLimit = item._reader.dataSize;
      input_00._reader._44_2_ = item._reader.pointerCount;
      input_00._reader._46_2_ = item._reader._38_2_;
      item._reader._32_8_ = uVar7;
      JsonCodec::decode(&local_240,codec,input_00,type,orphanage_00);
      field_00._8_8_ = SStack_200.raw;
      field_00.parent.super_Schema.raw = (Schema)(Schema)_local_208;
      field_00.proto._reader.segment = (SegmentReader *)local_1f8;
      field_00.proto._reader.capTable = (CapTableReader *)pSStack_1f0;
      field_00.proto._reader.data = local_1e8;
      field_00.proto._reader.pointers = (WirePointer *)pvStack_1e0;
      field_00.proto._reader._32_8_ = local_1d8;
      field_00.proto._reader.nestingLimit = SStack_1d0;
      field_00.proto._reader._44_2_ = SStack_1cc;
      field_00.proto._reader._46_2_ = uStack_1ca;
      DynamicStruct::Builder::adopt(&output,field_00,&local_240);
      Orphan<capnp::DynamicValue>::~Orphan(&local_240);
    }
    IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::operator++
              ((IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> *
               )local_e0);
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&>
            (&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
             ,0x2ea,FAILED,"field.getIndex() < items.size()","_kjCondition,",
             (DebugComparison<unsigned_int,_unsigned_int> *)local_170);
  kj::_::Debug::Fault::fatal(&local_188);
}

Assistant:

void decode(const JsonCodec& codec, JsonValue::Reader input,
              DynamicStruct::Builder output) const override {
    auto orphanage = Orphanage::getForMessageContaining(output);
    auto fields = output.getSchema().getFields();
    auto items = input.getArray();
    for (auto field: fields) {
      KJ_REQUIRE(field.getIndex() < items.size());
      auto item = items[field.getIndex()];
      if (!item.isNull()) {
        output.adopt(field, codec.decode(item, field.getType(), orphanage));
      }
    }
  }